

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
__thiscall
duckdb::Deserializer::
ReadPropertyWithExplicitDefault<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
          *default_value)

{
  char cVar1;
  undefined6 in_register_00000032;
  long *plVar2;
  undefined8 *in_R8;
  
  plVar2 = (long *)CONCAT62(in_register_00000032,field_id);
  cVar1 = (**(code **)(*plVar2 + 0x20))(plVar2,(ulong)tag & 0xffffffff,default_value);
  if (cVar1 == '\0') {
    (**(code **)(*plVar2 + 0x28))(plVar2,0);
    this->_vptr_Deserializer = (_func_int **)*in_R8;
    *in_R8 = 0;
  }
  else {
    Read<duckdb::unique_ptr<duckdb::DistinctStatistics,std::default_delete<duckdb::DistinctStatistics>,true>,duckdb::DistinctStatistics>
              (this);
    (**(code **)(*plVar2 + 0x28))(plVar2,1);
  }
  return (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         this;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}